

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsRowscale(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int i;
  int mini;
  DataArray<int> *rowscaleExp;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  cpp_dec_float<200U,_int,_void> *this_00;
  Real local_48;
  int local_40;
  int local_3c;
  DataArray<int> *local_38;
  undefined8 local_20;
  Real *local_18;
  Real *local_8;
  
  local_38 = *(DataArray<int> **)(in_RSI + 0x18);
  this_00 = in_RDI;
  local_3c = std::numeric_limits<int>::max();
  local_40 = 0;
  while( true ) {
    iVar3 = local_40;
    iVar1 = DataArray<int>::size(local_38);
    if (iVar1 <= iVar3) break;
    piVar2 = DataArray<int>::operator[](local_38,local_40);
    if (*piVar2 < local_3c) {
      piVar2 = DataArray<int>::operator[](local_38,local_40);
      local_3c = *piVar2;
    }
    local_40 = local_40 + 1;
  }
  local_48 = spxLdexp((Real)CONCAT44(iVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
  local_18 = &local_48;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)in_RDI,(type *)CONCAT44(iVar3,in_stack_ffffffffffffffa0));
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)this_00;
}

Assistant:

R SPxScaler<R>::minAbsRowscale() const
{
   const DataArray < int >& rowscaleExp = *m_activeRowscaleExp;

   int mini = std::numeric_limits<int>::max();

   for(int i = 0; i < rowscaleExp.size(); ++i)
      if(rowscaleExp[i] < mini)
         mini = rowscaleExp[i];

   return spxLdexp(1.0, mini);
}